

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::construct_storage(torrent *this)

{
  sha256_hash *this_00;
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  file_storage *pfVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  info_hash_t *piVar7;
  element_type *peVar8;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  storage_holder local_80;
  file_storage *local_70;
  element_type *local_68;
  string *local_60;
  uint local_58;
  vector<download_priority_t,_file_index_t> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  undefined1 local_34;
  undefined1 local_33;
  
  pfVar5 = torrent_info::orig_files
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar6 = (element_type *)
           torrent_info::orig_files
                     ((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  peVar2 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar8 = (element_type *)0x0;
  if (peVar6 != peVar2) {
    peVar8 = peVar2;
  }
  uVar1 = *(uint *)&this->field_0x5c0;
  this_00 = &(this->m_info_hash).v2;
  bVar3 = digest32<256L>::is_all_zeros(this_00);
  piVar7 = &this->m_info_hash;
  if (!bVar3) {
    piVar7 = (info_hash_t *)this_00;
  }
  local_48 = *(undefined8 *)(piVar7->v1).m_number._M_elems;
  uStack_40 = *(undefined8 *)((piVar7->v1).m_number._M_elems + 2);
  local_38 = (piVar7->v1).m_number._M_elems[4];
  bVar3 = torrent_info::v1((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  local_33 = torrent_info::v2((this->super_torrent_hot_members).m_torrent_file.
                              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  local_70 = pfVar5;
  local_68 = peVar8;
  local_60 = &this->m_save_path;
  local_58 = uVar1 >> 4 & 3;
  local_50 = &this->m_file_priority;
  local_34 = bVar3;
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [4])();
  ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::torrent,void>
            ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
             (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
  local_98 = local_a8;
  p_Stack_90 = p_Stack_a0;
  local_a8 = 0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar4))
            (&local_80,(undefined8 *)CONCAT44(extraout_var,iVar4),&local_70);
  storage_holder::operator=(&this->m_storage,&local_80);
  if (local_80.m_disk_io != (disk_interface *)0x0) {
    (*(local_80.m_disk_io)->_vptr_disk_interface[1])(local_80.m_disk_io,(ulong)local_80.m_idx.m_val)
    ;
  }
  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  return;
}

Assistant:

void torrent::construct_storage()
	{
		storage_params params{
			m_torrent_file->orig_files(),
			&m_torrent_file->orig_files() != &m_torrent_file->files()
				? &m_torrent_file->files() : nullptr,
			m_save_path,
			static_cast<storage_mode_t>(m_storage_mode),
			m_file_priority,
			m_info_hash.get_best(),
			m_torrent_file->v1(),
			m_torrent_file->v2()
		};

		// the shared_from_this() will create an intentional
		// cycle of ownership, se the hpp file for description.
		m_storage = m_ses.disk_thread().new_torrent(params, shared_from_this());
	}